

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

bool __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
::searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
           *this,KNNResultSet<double,_unsigned_long,_unsigned_long> *result_set,ElementType *vec,
          NodePtr node,DistanceType mindistsq,distance_vector_t *dists,float epsError)

{
  ulong uVar1;
  int iVar2;
  NodePtr pNVar3;
  DistanceType *pDVar4;
  long lVar5;
  long lVar6;
  IndexType *pIVar7;
  IndexType IVar8;
  IndexType *pIVar9;
  NodePtr node_00;
  bool bVar10;
  CountType CVar11;
  size_t i;
  long lVar12;
  NodePtr node_01;
  CountType CVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pNVar3 = node->child1;
  if ((pNVar3 == (NodePtr)0x0) && (node->child2 == (Node *)0x0)) {
    uVar14 = (node->node_type).lr.left;
    bVar10 = true;
    if (uVar14 < (node->node_type).lr.right) {
      pDVar4 = result_set->dists;
      CVar11 = result_set->capacity;
      dVar15 = pDVar4[CVar11 - 1];
      lVar5 = *(long *)this;
      lVar6 = *(long *)**(undefined8 **)(this + 0xa8);
      pIVar7 = result_set->indices;
      do {
        IVar8 = *(IndexType *)(lVar5 + uVar14 * 8);
        dVar17 = 0.0;
        lVar12 = 0;
        do {
          dVar16 = vec[lVar12] - *(double *)(lVar6 + IVar8 * 0x28 + 0x10 + lVar12 * 8);
          dVar17 = dVar17 + dVar16 * dVar16;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        if (dVar17 < dVar15) {
          if (result_set->count != 0) {
            pIVar9 = result_set->indices;
            CVar13 = result_set->count;
            do {
              CVar11 = result_set->capacity;
              if (pDVar4[CVar13 - 1] <= dVar17) goto LAB_001c1235;
              uVar1 = CVar13 - 1;
              if (CVar13 < CVar11) {
                pDVar4[CVar13] = pDVar4[CVar13 - 1];
                pIVar9[CVar13] = pIVar9[uVar1];
              }
              CVar13 = uVar1;
            } while (uVar1 != 0);
            CVar11 = result_set->capacity;
          }
          CVar13 = 0;
LAB_001c1235:
          if (CVar13 < CVar11) {
            pDVar4[CVar13] = dVar17;
            pIVar7[CVar13] = IVar8;
            CVar11 = result_set->capacity;
          }
          if (result_set->count < CVar11) {
            result_set->count = result_set->count + 1;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (node->node_type).lr.right);
    }
  }
  else {
    iVar2 = (node->node_type).sub.divfeat;
    dVar15 = vec[iVar2] - (node->node_type).sub.divlow;
    dVar17 = vec[iVar2] - (node->node_type).sub.divhigh;
    node_01 = pNVar3;
    node_00 = node->child2;
    if (dVar15 + dVar17 < 0.0) {
      node_01 = node->child2;
      node_00 = pNVar3;
    }
    bVar10 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                       (this,result_set,vec,node_00,mindistsq,dists,epsError);
    if (bVar10) {
      uVar14 = -(ulong)(dVar15 + dVar17 < 0.0);
      dVar17 = (double)(~uVar14 & (ulong)(dVar15 * dVar15) | (ulong)(dVar17 * dVar17) & uVar14);
      dVar15 = dists->_M_elems[iVar2];
      dVar16 = (mindistsq + dVar17) - dVar15;
      dists->_M_elems[iVar2] = dVar17;
      if ((result_set->dists[result_set->capacity - 1] < (double)epsError * dVar16) ||
         (bVar10 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                             (this,result_set,vec,node_01,dVar16,dists,epsError), bVar10)) {
        dists->_M_elems[iVar2] = dVar15;
        return true;
      }
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool searchLevel(RESULTSET &result_set, const ElementType *vec,
                   const NodePtr node, DistanceType mindistsq,
                   distance_vector_t &dists, const float epsError) const {
    /* If this is a leaf node, then do check and return. */
    if ((node->child1 == NULL) && (node->child2 == NULL)) {
      // count_leaf += (node->lr.right-node->lr.left);  // Removed since was
      // neither used nor returned to the user.
      DistanceType worst_dist = result_set.worstDist();
      for (IndexType i = node->node_type.lr.left; i < node->node_type.lr.right;
           ++i) {
        const IndexType index = BaseClassRef::vind[i]; // reorder... : i;
        DistanceType dist = distance.evalMetric(
            vec, index, (DIM > 0 ? DIM : BaseClassRef::dim));
        if (dist < worst_dist) {
          if (!result_set.addPoint(dist, BaseClassRef::vind[i])) {
            // the resultset doesn't want to receive any more points, we're done
            // searching!
            return false;
          }
        }
      }
      return true;
    }

    /* Which child branch should be taken first? */
    int idx = node->node_type.sub.divfeat;
    ElementType val = vec[idx];
    DistanceType diff1 = val - node->node_type.sub.divlow;
    DistanceType diff2 = val - node->node_type.sub.divhigh;

    NodePtr bestChild;
    NodePtr otherChild;
    DistanceType cut_dist;
    if ((diff1 + diff2) < 0) {
      bestChild = node->child1;
      otherChild = node->child2;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divhigh, idx);
    } else {
      bestChild = node->child2;
      otherChild = node->child1;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divlow, idx);
    }

    /* Call recursively to search next level down. */
    if (!searchLevel(result_set, vec, bestChild, mindistsq, dists, epsError)) {
      // the resultset doesn't want to receive any more points, we're done
      // searching!
      return false;
    }

    DistanceType dst = dists[idx];
    mindistsq = mindistsq + cut_dist - dst;
    dists[idx] = cut_dist;
    if (mindistsq * epsError <= result_set.worstDist()) {
      if (!searchLevel(result_set, vec, otherChild, mindistsq, dists,
                       epsError)) {
        // the resultset doesn't want to receive any more points, we're done
        // searching!
        return false;
      }
    }
    dists[idx] = dst;
    return true;
  }